

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode UA_Server_run_startup(UA_Server *server)

{
  UA_ServerNetworkLayer *pUVar1;
  uint uVar2;
  ulong uVar3;
  UA_StatusCode UVar4;
  long lVar5;
  
  if ((server->config).networkLayersSize == 0) {
    UVar4 = 0;
  }
  else {
    lVar5 = 0;
    UVar4 = 0;
    uVar3 = 0;
    do {
      pUVar1 = (server->config).networkLayers;
      uVar2 = (**(code **)((long)&pUVar1->start + lVar5))
                        ((long)&pUVar1->handle + lVar5,(server->config).logger);
      UVar4 = UVar4 | uVar2;
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + 0x38;
    } while (uVar3 < (server->config).networkLayersSize);
  }
  return UVar4;
}

Assistant:

UA_StatusCode UA_Server_run_startup(UA_Server *server) {
#ifdef UA_ENABLE_MULTITHREADING
    /* Spin up the worker threads */
    UA_LOG_INFO(server->config.logger, UA_LOGCATEGORY_SERVER,
                "Spinning up %u worker thread(s)", server->config.nThreads);
    pthread_cond_init(&server->dispatchQueue_condition, 0);
    pthread_mutex_init(&server->dispatchQueue_mutex, 0);
    server->workers = UA_malloc(server->config.nThreads * sizeof(UA_Worker));
    if(!server->workers)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    for(size_t i = 0; i < server->config.nThreads; ++i) {
        UA_Worker *worker = &server->workers[i];
        worker->server = server;
        worker->counter = 0;
        worker->running = true;
        pthread_create(&worker->thr, NULL, (void* (*)(void*))workerLoop, worker);
    }

    /* Try to execute delayed callbacks every 10 sec */
    UA_Job processDelayed = {.type = UA_JOBTYPE_METHODCALL,
                             .job.methodCall = {.method = dispatchDelayedJobs, .data = NULL} };
    UA_Server_addRepeatedJob(server, processDelayed, 10000, NULL);
#endif

    /* Start the networklayers */
    UA_StatusCode result = UA_STATUSCODE_GOOD;
    for(size_t i = 0; i < server->config.networkLayersSize; ++i) {
        UA_ServerNetworkLayer *nl = &server->config.networkLayers[i];
        result |= nl->start(nl, server->config.logger);
    }

    return result;
}